

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_string.cpp
# Opt level: O0

int __thiscall ON_String::Replace(ON_String *this,char *token1,char *token2)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  size_t sVar5;
  int *piVar6;
  ON_aStringHeader *pOVar7;
  int local_98;
  int local_80;
  int j;
  int ni;
  int i1;
  int i0;
  int newlen;
  int local_5c;
  char *pcStack_58;
  int i;
  char *s;
  ON_SimpleArray<int> n;
  int len;
  int len2;
  int len1;
  int count;
  char *token2_local;
  char *token1_local;
  ON_String *this_local;
  
  len2 = 0;
  if ((token1 != (char *)0x0) && (*token1 != '\0')) {
    _len1 = token2;
    if (token2 == (char *)0x0) {
      _len1 = "";
    }
    sVar5 = strlen(token1);
    iVar3 = (int)sVar5;
    if (0 < iVar3) {
      sVar5 = strlen(_len1);
      n.m_capacity = (int)sVar5;
      n.m_count = Length(this);
      if (iVar3 <= n.m_count) {
        ON_SimpleArray<int>::ON_SimpleArray((ON_SimpleArray<int> *)&s,0x20);
        pcStack_58 = this->m_s;
        local_5c = 0;
        while (local_5c <= n.m_count - iVar3) {
          iVar4 = strncmp(pcStack_58,token1,(long)iVar3);
          if (iVar4 == 0) {
            ON_SimpleArray<int>::Append((ON_SimpleArray<int> *)&s,&local_5c);
            local_5c = iVar3 + local_5c;
            pcStack_58 = pcStack_58 + iVar3;
          }
          else {
            pcStack_58 = pcStack_58 + 1;
            local_5c = local_5c + 1;
          }
        }
        len2 = ON_SimpleArray<int>::Count((ON_SimpleArray<int> *)&s);
        iVar4 = n.m_count + len2 * (n.m_capacity - iVar3);
        if (iVar4 == 0) {
          Destroy(this);
          bVar2 = true;
          this_local._4_4_ = len2;
        }
        else {
          CopyArray(this);
          local_98 = iVar4;
          if (iVar4 < n.m_count) {
            local_98 = n.m_count;
          }
          ReserveArray(this,(long)local_98);
          if (iVar3 < n.m_capacity) {
            ni = n.m_count;
            for (local_80 = 0; j = iVar4, iVar1 = len2, local_80 < len2; local_80 = local_80 + 1) {
              piVar6 = ON_SimpleArray<int>::operator[]((ON_SimpleArray<int> *)&s,local_80);
              iVar1 = *piVar6;
              piVar6 = ON_SimpleArray<int>::operator[]((ON_SimpleArray<int> *)&s,local_80);
              *piVar6 = iVar1 + iVar3;
            }
            while (local_80 = iVar1 + -1, -1 < local_80) {
              piVar6 = ON_SimpleArray<int>::operator[]((ON_SimpleArray<int> *)&s,local_80);
              iVar1 = *piVar6;
              while (iVar1 < ni) {
                ni = ni + -1;
                j = j + -1;
                this->m_s[j] = this->m_s[ni];
              }
              j = j - n.m_capacity;
              ni = ni - iVar3;
              memcpy(this->m_s + j,_len1,(long)n.m_capacity);
              iVar1 = local_80;
            }
          }
          else {
            piVar6 = ON_SimpleArray<int>::operator[]((ON_SimpleArray<int> *)&s,0);
            j = *piVar6;
            ON_SimpleArray<int>::Append((ON_SimpleArray<int> *)&s,&n.m_count);
            ni = j;
            for (local_80 = 0; local_80 < len2; local_80 = local_80 + 1) {
              if (0 < n.m_capacity) {
                memcpy(this->m_s + j,_len1,(long)n.m_capacity);
                j = n.m_capacity + j;
              }
              piVar6 = ON_SimpleArray<int>::operator[]((ON_SimpleArray<int> *)&s,local_80 + 1);
              iVar1 = *piVar6;
              ni = ni + iVar3;
              while (ni < iVar1) {
                this->m_s[j] = this->m_s[ni];
                j = j + 1;
                ni = ni + 1;
              }
            }
          }
          pOVar7 = Header(this);
          pOVar7->string_length = iVar4;
          this->m_s[iVar4] = '\0';
          bVar2 = false;
        }
        ON_SimpleArray<int>::~ON_SimpleArray((ON_SimpleArray<int> *)&s);
        if (bVar2) {
          return this_local._4_4_;
        }
      }
    }
  }
  return len2;
}

Assistant:

int ON_String::Replace( const char* token1, const char* token2 )
{
  int count = 0;

  if ( 0 != token1 && 0 != token1[0] )
  {
    if ( 0 == token2 )
      token2 = "";
    const int len1 = (int)strlen(token1);
    if ( len1 > 0 )
    {
      const int len2 = (int)strlen(token2);
      int len = Length();
      if ( len >= len1 )
      {
        // in-place
        ON_SimpleArray<int> n(32);
        const char* s = m_s;
        int i;
        for ( i = 0; i <= len-len1; /*empty*/ )
        {
          if ( strncmp(s,token1,len1) )
          {
            s++;
            i++;
          }
          else
          {
            n.Append(i);
            i += len1;
            s += len1;
          }
        }

        count = n.Count();

        // reserve array space - must be done even when len2 <= len1
        // so that shared arrays are not corrupted.
        const int newlen = len + (count*(len2-len1));
        if ( 0 == newlen )
        {
          Destroy();
          return count;
        }

        CopyArray();

        // 24 August 2006 Dale Lear
        //    This used to say
        //       ReserveArray(newlen);
        //    but when newlen < len and the string had multiple
        //    references, the ReserveArray(newlen) call truncated
        //    the input array.  
        ReserveArray( ((newlen<len) ? len : newlen) );

        int i0, i1, ni, j;

        if ( len2 > len1 )
        {
          // copy from back to front
          i1 = newlen;
          i0 = len;
          for ( ni =0; ni < count; ni++ )
            n[ni] = n[ni] + len1;
          for ( ni = count-1; ni >= 0; ni-- )
          {
            j = n[ni];
            while ( i0 > j )
            {
              i0--;
              i1--;
              m_s[i1] = m_s[i0];
            }
            i1 -= len2;
            i0 -= len1;
            memcpy(&m_s[i1],token2,len2*sizeof(m_s[0]));
          }
        }
        else
        {
          // copy from front to back
          i0 = i1 = n[0];
          n.Append(len);
          for ( ni = 0; ni < count; ni++ )
          {
            if ( len2 > 0 )
            {
              memcpy(&m_s[i1],token2,len2*sizeof(m_s[0]));
              i1 += len2;
            }
            i0 += len1;
            j = n[ni+1];
            while ( i0 < j )
            {
              m_s[i1++] = m_s[i0++];
            }
          }
        }
        Header()->string_length = newlen;
        m_s[newlen] = 0;
      }
    }
  }

  return count;
}